

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

ssl_peer_type get_peer_type(char *hostname)

{
  int iVar1;
  undefined1 local_28 [8];
  in6_addr addr;
  char *hostname_local;
  
  if ((hostname != (char *)0x0) && (*hostname != '\0')) {
    addr.__in6_u._8_8_ = hostname;
    iVar1 = inet_pton(2,hostname,local_28);
    if (iVar1 != 0) {
      return CURL_SSL_PEER_IPV4;
    }
    iVar1 = inet_pton(10,(char *)addr.__in6_u._8_8_,local_28);
    if (iVar1 != 0) {
      return CURL_SSL_PEER_IPV6;
    }
  }
  return CURL_SSL_PEER_DNS;
}

Assistant:

static ssl_peer_type get_peer_type(const char *hostname)
{
  if(hostname && hostname[0]) {
#ifdef USE_IPV6
    struct in6_addr addr;
#else
    struct in_addr addr;
#endif
    if(curlx_inet_pton(AF_INET, hostname, &addr))
      return CURL_SSL_PEER_IPV4;
#ifdef USE_IPV6
    else if(curlx_inet_pton(AF_INET6, hostname, &addr)) {
      return CURL_SSL_PEER_IPV6;
    }
#endif
  }
  return CURL_SSL_PEER_DNS;
}